

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_ssm_scan(ggml_compute_params *params,ggml_tensor *dst)

{
  float fVar1;
  uint uVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  ulong uVar8;
  ggml_tensor *pgVar9;
  ulong uVar10;
  ulong uVar11;
  void *pvVar12;
  size_t sVar13;
  void *pvVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  void *pvVar18;
  void *pvVar19;
  size_t sVar20;
  size_t sVar21;
  size_t sVar22;
  size_t sVar23;
  void *pvVar24;
  void *pvVar25;
  undefined1 auVar26 [16];
  int iVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  char *pcVar32;
  int i0;
  int iVar33;
  ulong uVar34;
  undefined8 uVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 extraout_var [60];
  
  pgVar3 = dst->src[0];
  if (pgVar3->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ops.cpp"
               ,0x1da7,"fatal error");
  }
  pgVar4 = dst->src[4];
  pgVar5 = dst->src[1];
  pgVar6 = dst->src[3];
  pgVar7 = dst->src[2];
  iVar33 = params->ith;
  iVar27 = params->nth;
  lVar31 = pgVar3->ne[1];
  uVar8 = pgVar3->ne[0];
  pgVar9 = dst->src[5];
  uVar10 = pgVar5->ne[1];
  uVar11 = pgVar3->ne[2];
  lVar28 = ggml_nelements(pgVar5);
  lVar29 = ggml_nelements(pgVar3);
  lVar30 = ggml_nelements(dst);
  if (lVar29 + lVar28 == lVar30) {
    if (pgVar3->nb[0] == 4) {
      if (pgVar5->nb[0] == 4) {
        if (pgVar7->nb[0] == 4) {
          if (pgVar6->nb[0] == 4) {
            if (pgVar4->nb[0] == 4) {
              if (pgVar9->nb[0] == 4) {
                if (pgVar3->nb[1] == pgVar3->ne[0] << 2) {
                  if (pgVar3->nb[2] == pgVar3->nb[1] * pgVar3->ne[1]) {
                    if (pgVar5->nb[3] == pgVar5->ne[0] * pgVar5->ne[1] * pgVar5->ne[2] * 4) {
                      iVar27 = (int)(((long)iVar27 + -1 + lVar31) / (long)iVar27);
                      iVar33 = iVar33 * iVar27;
                      iVar27 = iVar27 + iVar33;
                      lVar28 = (long)iVar33;
                      if (lVar31 <= iVar27) {
                        iVar27 = (int)lVar31;
                      }
                      for (uVar36 = 0; uVar36 != (~((long)uVar11 >> 0x3f) & uVar11);
                          uVar36 = uVar36 + 1) {
                        for (uVar37 = 0; uVar37 != (~((long)uVar10 >> 0x3f) & uVar10);
                            uVar37 = uVar37 + 1) {
                          pvVar12 = pgVar5->data;
                          sVar13 = pgVar7->nb[0];
                          lVar40 = pgVar3->nb[1] * lVar28;
                          lVar31 = pgVar3->nb[2] * uVar36;
                          lVar30 = pgVar5->nb[0] * lVar28;
                          pvVar14 = pgVar7->data;
                          lVar29 = pgVar5->nb[2] * uVar36 + pgVar5->nb[1] * uVar37;
                          sVar15 = pgVar7->nb[1];
                          sVar16 = pgVar7->nb[2];
                          sVar17 = pgVar6->nb[1];
                          pvVar18 = pgVar6->data;
                          pvVar19 = dst->data;
                          lVar41 = (long)pvVar19 + pgVar5->nb[3] + lVar31 + lVar40;
                          sVar20 = pgVar9->nb[2];
                          sVar21 = pgVar9->nb[1];
                          sVar22 = pgVar4->nb[1];
                          lVar31 = (long)pgVar3->data + lVar31 + lVar40;
                          if (uVar37 != 0) {
                            lVar31 = lVar41;
                          }
                          lVar40 = 0;
                          sVar23 = pgVar4->nb[2];
                          pvVar24 = pgVar9->data;
                          pvVar25 = pgVar4->data;
                          for (uVar39 = 0;
                              uVar39 != (uint)(~(iVar27 - iVar33 >> 0x1f) & iVar27 - iVar33);
                              uVar39 = uVar39 + 1) {
                            fVar43 = *(float *)((long)pvVar14 +
                                               uVar39 * 4 +
                                               sVar16 * uVar36 + sVar15 * uVar37 + sVar13 * lVar28);
                            if (fVar43 <= 20.0) {
                              fVar43 = expf(fVar43);
                              fVar43 = log1pf(fVar43);
                            }
                            fVar1 = *(float *)((long)pvVar12 + uVar39 * 4 + lVar29 + lVar30);
                            auVar44._0_12_ = ZEXT812(0);
                            auVar44._12_4_ = 0;
                            lVar42 = lVar40;
                            for (uVar34 = 0; (~((long)uVar8 >> 0x3f) & uVar8) != uVar34;
                                uVar34 = uVar34 + 1) {
                              lVar38 = lVar42 >> 0x1e;
                              uVar2 = *(uint *)(lVar31 + lVar38);
                              auVar45._0_4_ =
                                   expf(fVar43 * *(float *)((long)pvVar18 + lVar38 + sVar17 * lVar28
                                                           ));
                              auVar45._4_60_ = extraout_var;
                              auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar43 * fVar1 *
                                                                      *(float *)((long)pvVar25 +
                                                                                uVar34 * 4 +
                                                                                sVar22 * uVar37 +
                                                                                sVar23 * uVar36))),
                                                        auVar45._0_16_,ZEXT416(uVar2));
                              auVar44 = vfmadd231ss_fma(ZEXT416(auVar44._0_4_),auVar26,
                                                        ZEXT416(*(uint *)((long)pvVar24 +
                                                                         uVar34 * 4 +
                                                                         sVar21 * uVar37 +
                                                                         sVar20 * uVar36)));
                              *(int *)(lVar41 + lVar38) = auVar26._0_4_;
                              lVar42 = lVar42 + 0x100000000;
                            }
                            lVar40 = lVar40 + (uVar8 << 0x20);
                            *(uint *)((long)pvVar19 + uVar39 * 4 + lVar29 + lVar30) = auVar44._0_4_;
                          }
                        }
                      }
                      return;
                    }
                    pcVar32 = "src1->nb[3] == src1->ne[0]*src1->ne[1]*src1->ne[2]*sizeof(float)";
                    uVar35 = 0x1d70;
                  }
                  else {
                    pcVar32 = "src0->nb[2] == src0->ne[0]*src0->ne[1]*sizeof(float)";
                    uVar35 = 0x1d6e;
                  }
                }
                else {
                  pcVar32 = "src0->nb[1] == src0->ne[0]*sizeof(float)";
                  uVar35 = 0x1d6c;
                }
              }
              else {
                pcVar32 = "src5->nb[0] == sizeof(float)";
                uVar35 = 0x1d6a;
              }
            }
            else {
              pcVar32 = "src4->nb[0] == sizeof(float)";
              uVar35 = 0x1d69;
            }
          }
          else {
            pcVar32 = "src3->nb[0] == sizeof(float)";
            uVar35 = 0x1d68;
          }
        }
        else {
          pcVar32 = "src2->nb[0] == sizeof(float)";
          uVar35 = 0x1d67;
        }
      }
      else {
        pcVar32 = "src1->nb[0] == sizeof(float)";
        uVar35 = 0x1d66;
      }
    }
    else {
      pcVar32 = "src0->nb[0] == sizeof(float)";
      uVar35 = 0x1d65;
    }
  }
  else {
    pcVar32 = "ggml_nelements(src1) + ggml_nelements(src0) == ggml_nelements(dst)";
    uVar35 = 0x1d64;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ops.cpp"
             ,uVar35,"GGML_ASSERT(%s) failed",pcVar32);
}

Assistant:

void ggml_compute_forward_ssm_scan(
        const ggml_compute_params * params,
        ggml_tensor * dst) {
    switch (dst->src[0]->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_ssm_scan_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}